

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMemory.cpp
# Opt level: O2

int adios2::helper::NdCopy
              (char *in,CoreDims *inStart,CoreDims *inCount,bool inIsRowMajor,bool inIsLittleEndian,
              char *out,CoreDims *outStart,CoreDims *outCount,bool outIsRowMajor,
              bool outIsLittleEndian,int typeSize,CoreDims *inMemStart,CoreDims *inMemCount,
              CoreDims *outMemStart,CoreDims *outMemCount,bool safeMode,MemorySpace MemSpace,
              bool duringWrite)

{
  size_t *psVar1;
  bool bVar2;
  size_t i_2;
  ulong uVar3;
  size_t sVar4;
  byte bVar5;
  undefined7 in_register_00000009;
  CoreDims *inCount_00;
  long lVar7;
  CoreDims *ovlpEnd_00;
  CoreDims *ovlpEnd_01;
  CoreDims *ovlpEnd_02;
  char *pcVar8;
  CoreDims *ovlpEnd_03;
  DimsArray *ioStart;
  size_t sVar9;
  char *outBase;
  size_t sVar10;
  CoreDims *pCVar11;
  size_t minCountDim;
  undefined7 in_register_00000081;
  size_t res;
  size_t elmSize;
  CoreDims *pCVar12;
  allocator_type local_1399;
  CoreDims *local_1398;
  undefined4 local_138c;
  CoreDims *local_1388;
  char *local_1380;
  char *local_1378;
  uint local_136c;
  size_t local_1368;
  size_t local_1360;
  char *local_1358;
  DimsArray ovlpCount;
  DimsArray revInStart;
  size_t blockSize;
  char **local_1128;
  char *local_1120 [32];
  size_t minContDim;
  char **local_1018;
  char *local_1010 [32];
  DimsArray ovlpStart;
  DimsArray inStride;
  DimsArray outStride;
  DimsArray inEnd;
  DimsArray outRltvOvlpStartPos;
  DimsArray inRltvOvlpStartPos;
  DimsArray outMemCountNC;
  DimsArray inMemCountNC;
  DimsArray outMemStartNC;
  DimsArray inMemStartNC;
  DimsArray outOvlpGapSize;
  DimsArray inOvlpGapSize;
  DimsArray ovlpEnd;
  DimsArray outEnd;
  CoreDims *pCVar6;
  
  pCVar6 = (CoreDims *)CONCAT71(in_register_00000081,inIsLittleEndian);
  local_138c = SUB84(pCVar6,0);
  local_136c = (uint)CONCAT71(in_register_00000009,inIsRowMajor);
  if (inMemStart->DimCount == 0) {
    inMemStart = inStart;
  }
  sVar10 = inMemStart->DimCount;
  psVar1 = inMemStartNC.Dimensions;
  local_1388 = inStart;
  local_1358 = out;
  inMemStartNC.super_CoreDims.DimCount = sVar10;
  inMemStartNC.super_CoreDims.DimensSpan = psVar1;
  memset(psVar1,0,0x100);
  if (sVar10 != 0) {
    memmove(psVar1,inMemStart->DimensSpan,sVar10 * 8);
  }
  if (inMemCount->DimCount == 0) {
    inMemCount = inCount;
  }
  sVar4 = inMemCount->DimCount;
  psVar1 = inMemCountNC.Dimensions;
  local_1398 = inCount;
  local_1368 = sVar10;
  inMemCountNC.super_CoreDims.DimCount = sVar4;
  inMemCountNC.super_CoreDims.DimensSpan = psVar1;
  memset(psVar1,0,0x100);
  if (sVar4 != 0) {
    memmove(psVar1,inMemCount->DimensSpan,sVar4 << 3);
  }
  if (outMemStart->DimCount == 0) {
    outMemStart = outStart;
  }
  sVar10 = outMemStart->DimCount;
  psVar1 = outMemStartNC.Dimensions;
  outMemStartNC.super_CoreDims.DimCount = sVar10;
  outMemStartNC.super_CoreDims.DimensSpan = psVar1;
  memset(psVar1,0,0x100);
  outBase = local_1358;
  if (sVar10 != 0) {
    memmove(psVar1,outMemStart->DimensSpan,sVar10 * 8);
  }
  if (outMemCount->DimCount == 0) {
    outMemCount = outCount;
  }
  sVar4 = outMemCount->DimCount;
  psVar1 = outMemCountNC.Dimensions;
  local_1360 = sVar10;
  outMemCountNC.super_CoreDims.DimCount = sVar4;
  outMemCountNC.super_CoreDims.DimensSpan = psVar1;
  memset(psVar1,0,0x100);
  if (sVar4 != 0) {
    memmove(psVar1,outMemCount->DimensSpan,sVar4 << 3);
  }
  pCVar12 = local_1388;
  sVar10 = local_1388->DimCount;
  inEnd.super_CoreDims.DimensSpan = inEnd.Dimensions;
  inEnd.super_CoreDims.DimCount = sVar10;
  memset(inEnd.super_CoreDims.DimensSpan,0,0x100);
  outEnd.super_CoreDims.DimensSpan = outEnd.Dimensions;
  outEnd.super_CoreDims.DimCount = sVar10;
  memset(outEnd.super_CoreDims.DimensSpan,0,0x100);
  ovlpStart.super_CoreDims.DimensSpan = ovlpStart.Dimensions;
  ovlpStart.super_CoreDims.DimCount = sVar10;
  memset(ovlpStart.super_CoreDims.DimensSpan,0,0x100);
  ovlpEnd.super_CoreDims.DimensSpan = ovlpEnd.Dimensions;
  ovlpEnd.super_CoreDims.DimCount = sVar10;
  memset(ovlpEnd.super_CoreDims.DimensSpan,0,0x100);
  ovlpCount.super_CoreDims.DimensSpan = ovlpCount.Dimensions;
  ovlpCount.super_CoreDims.DimCount = sVar10;
  memset(ovlpCount.super_CoreDims.DimensSpan,0,0x100);
  inStride.super_CoreDims.DimensSpan = inStride.Dimensions;
  inStride.super_CoreDims.DimCount = sVar10;
  memset(inStride.super_CoreDims.DimensSpan,0,0x100);
  outStride.super_CoreDims.DimensSpan = outStride.Dimensions;
  outStride.super_CoreDims.DimCount = sVar10;
  memset(outStride.super_CoreDims.DimensSpan,0,0x100);
  inOvlpGapSize.super_CoreDims.DimensSpan = inOvlpGapSize.Dimensions;
  inOvlpGapSize.super_CoreDims.DimCount = sVar10;
  memset(inOvlpGapSize.super_CoreDims.DimensSpan,0,0x100);
  outOvlpGapSize.super_CoreDims.DimensSpan = outOvlpGapSize.Dimensions;
  outOvlpGapSize.super_CoreDims.DimCount = sVar10;
  memset(outOvlpGapSize.super_CoreDims.DimensSpan,0,0x100);
  inRltvOvlpStartPos.super_CoreDims.DimensSpan = inRltvOvlpStartPos.Dimensions;
  inRltvOvlpStartPos.super_CoreDims.DimCount = sVar10;
  memset(inRltvOvlpStartPos.super_CoreDims.DimensSpan,0,0x100);
  outRltvOvlpStartPos.super_CoreDims.DimensSpan = outRltvOvlpStartPos.Dimensions;
  outRltvOvlpStartPos.super_CoreDims.DimCount = sVar10;
  memset(outRltvOvlpStartPos.super_CoreDims.DimensSpan,0,0x100);
  pCVar11 = local_1388;
  inCount_00 = (CoreDims *)((ulong)local_136c ^ 1);
  if ((byte)inCount_00 == 0 && outIsRowMajor) {
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&inEnd,pCVar12,local_1398,inCount_00);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&outEnd,outStart,outCount,inCount_00);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&ovlpStart,pCVar12,outStart,inCount_00);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&ovlpEnd,&inEnd.super_CoreDims,&outEnd.super_CoreDims,
               inCount_00);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&ovlpCount,&ovlpStart.super_CoreDims,
               &ovlpEnd.super_CoreDims,inCount_00);
    bVar2 = NdCopy::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&ovlpStart,&ovlpEnd.super_CoreDims,ovlpEnd_01);
    if (!bVar2) {
      return 1;
    }
    pCVar12 = (CoreDims *)(long)typeSize;
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&inStride,&inMemCountNC.super_CoreDims,pCVar12,
               (size_t)inCount_00);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&outStride,&outMemCountNC.super_CoreDims,pCVar12,
               (size_t)inCount_00);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&inOvlpGapSize,&inStride.super_CoreDims,
               &inMemCountNC.super_CoreDims,&ovlpCount.super_CoreDims,pCVar6);
    sVar4 = 0x460d7c;
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&outOvlpGapSize,&outStride.super_CoreDims,
               &outMemCountNC.super_CoreDims,&ovlpCount.super_CoreDims,pCVar6);
    for (sVar10 = 0; inMemStartNC.super_CoreDims.DimCount != sVar10; sVar10 = sVar10 + 1) {
      in = in + (ovlpStart.super_CoreDims.DimensSpan[sVar10] -
                inMemStartNC.super_CoreDims.DimensSpan[sVar10]) *
                inStride.super_CoreDims.DimensSpan[sVar10];
    }
    for (sVar10 = 0; minCountDim = ovlpCount.super_CoreDims.DimCount,
        outMemStartNC.super_CoreDims.DimCount != sVar10; sVar10 = sVar10 + 1) {
      outBase = outBase + (ovlpStart.super_CoreDims.DimensSpan[sVar10] -
                          outMemStartNC.super_CoreDims.DimensSpan[sVar10]) *
                          outStride.super_CoreDims.DimensSpan[sVar10];
    }
    do {
      minCountDim = minCountDim - 1;
      uVar3 = minCountDim;
      pCVar6 = pCVar12;
      if ((minCountDim == 0) ||
         (inMemCountNC.super_CoreDims.DimensSpan[minCountDim] !=
          ovlpCount.super_CoreDims.DimensSpan[minCountDim])) break;
    } while (outMemCountNC.super_CoreDims.DimensSpan[minCountDim] ==
             inMemCountNC.super_CoreDims.DimensSpan[minCountDim]);
    for (; uVar3 < ovlpCount.super_CoreDims.DimCount; uVar3 = uVar3 + 1) {
      psVar1 = ovlpCount.super_CoreDims.DimensSpan + uVar3;
      pCVar6 = (CoreDims *)((long)pCVar6 * *psVar1);
    }
    local_1380 = outBase;
    local_1378 = in;
    blockSize = (size_t)pCVar6;
    minContDim = minCountDim;
    if ((bool)(char)local_138c != outIsLittleEndian) {
      if (!safeMode) {
        NdCopyRecurDFSeqPaddingRevEndian
                  (0,&local_1378,&local_1380,&inOvlpGapSize.super_CoreDims,
                   &outOvlpGapSize.super_CoreDims,&ovlpCount.super_CoreDims,minCountDim,
                   (size_t)pCVar12,(ulong)pCVar6 / (ulong)pCVar12,sVar4);
        return 0;
      }
      sVar10 = 0;
      DimsArray::DimsArray(&revInStart,ovlpCount.super_CoreDims.DimCount,0);
      do {
        for (; minCountDim != sVar10; sVar10 = sVar10 + 1) {
          revInStart.super_CoreDims.DimensSpan[sVar10] =
               revInStart.super_CoreDims.DimensSpan[sVar10] + 1;
        }
        for (uVar3 = 0; sVar4 = minCountDim, uVar3 != (ulong)pCVar6 / (ulong)pCVar12;
            uVar3 = uVar3 + 1) {
          pcVar8 = outBase;
          pCVar11 = pCVar12;
          while (pCVar11 != (CoreDims *)0x0) {
            *pcVar8 = (in + -1)[(long)pCVar11];
            pcVar8 = pcVar8 + 1;
            pCVar11 = (CoreDims *)((long)&pCVar11[-1].DimensSpan + 7);
          }
          outBase = outBase + (long)pCVar12;
          in = in + (long)pCVar12;
        }
        do {
          sVar10 = sVar4 - 1;
          if (sVar4 == 0) {
            return 0;
          }
          in = in + inOvlpGapSize.super_CoreDims.DimensSpan[sVar4];
          outBase = outBase + outOvlpGapSize.super_CoreDims.DimensSpan[sVar4];
          revInStart.super_CoreDims.DimensSpan[sVar4] = 0;
          sVar4 = sVar10;
        } while (revInStart.super_CoreDims.DimensSpan[sVar10] ==
                 ovlpCount.super_CoreDims.DimensSpan[sVar10]);
      } while( true );
    }
    if (!safeMode) {
      NdCopyRecurDFSeqPadding
                (0,&local_1378,&local_1380,&inOvlpGapSize.super_CoreDims,
                 &outOvlpGapSize.super_CoreDims,&ovlpCount.super_CoreDims,&minContDim,&blockSize);
      return 0;
    }
    sVar10 = 0;
    DimsArray::DimsArray(&revInStart,ovlpCount.super_CoreDims.DimCount,0);
    do {
      for (; minCountDim != sVar10; sVar10 = sVar10 + 1) {
        revInStart.super_CoreDims.DimensSpan[sVar10] =
             revInStart.super_CoreDims.DimensSpan[sVar10] + 1;
      }
      memcpy(outBase,in,(size_t)pCVar6);
      in = in + (long)pCVar6;
      outBase = outBase + (long)pCVar6;
      sVar4 = minCountDim;
      do {
        sVar10 = sVar4 - 1;
        if (sVar4 == 0) {
          return 0;
        }
        in = in + inOvlpGapSize.super_CoreDims.DimensSpan[sVar4];
        outBase = outBase + outOvlpGapSize.super_CoreDims.DimensSpan[sVar4];
        revInStart.super_CoreDims.DimensSpan[sVar4] = 0;
        sVar4 = sVar10;
      } while (revInStart.super_CoreDims.DimensSpan[sVar10] ==
               ovlpCount.super_CoreDims.DimensSpan[sVar10]);
    } while( true );
  }
  if ((char)local_136c == '\0' && !outIsRowMajor) {
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&inEnd,local_1388,local_1398,inCount_00);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&outEnd,outStart,outCount,inCount_00);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&ovlpStart,pCVar11,outStart,inCount_00);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&ovlpEnd,&inEnd.super_CoreDims,&outEnd.super_CoreDims,
               inCount_00);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&ovlpCount,&ovlpStart.super_CoreDims,
               &ovlpEnd.super_CoreDims,inCount_00);
    bVar2 = NdCopy::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&ovlpStart,&ovlpEnd.super_CoreDims,ovlpEnd_02);
    if (!bVar2) {
      return 1;
    }
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&inStride,local_1398,(CoreDims *)(long)typeSize,
               (size_t)inCount_00);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&outStride,outCount,(CoreDims *)(long)typeSize,
               (size_t)inCount_00);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&inRltvOvlpStartPos,&inMemStartNC.super_CoreDims,
               &ovlpStart.super_CoreDims,inCount_00);
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&outRltvOvlpStartPos,&outMemStartNC.super_CoreDims,
               &ovlpStart.super_CoreDims,inCount_00);
  }
  else {
    bVar5 = (byte)inCount_00 | outIsRowMajor;
    pCVar6 = (CoreDims *)(ulong)CONCAT31((int3)(local_136c >> 8),bVar5);
    if (bVar5 == 0) {
      sVar10 = outStart->DimCount;
      psVar1 = revInStart.Dimensions;
      revInStart.super_CoreDims.DimCount = sVar10;
      revInStart.super_CoreDims.DimensSpan = psVar1;
      memset(psVar1,0,0x100);
      if (sVar10 != 0) {
        memmove(psVar1,outStart->DimensSpan,sVar10 << 3);
      }
      sVar10 = outCount->DimCount;
      minContDim = sVar10;
      local_1018 = local_1010;
      memset(local_1010,0,0x100);
      pCVar11 = local_1388;
      pCVar12 = local_1398;
      if (sVar10 != 0) {
        memmove(local_1010,outCount->DimensSpan,sVar10 << 3);
      }
      std::__reverse<unsigned_long*>(outMemStartNC.Dimensions,outMemStartNC.Dimensions + local_1360)
      ;
      std::__reverse<unsigned_long*>
                (outMemCountNC.super_CoreDims.DimensSpan,
                 outMemCountNC.super_CoreDims.DimensSpan + outMemCountNC.super_CoreDims.DimCount);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&inEnd,pCVar11,pCVar12,pCVar6);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&outEnd,&revInStart.super_CoreDims,
                 (CoreDims *)&minContDim,pCVar6);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&ovlpStart,pCVar11,&revInStart.super_CoreDims,pCVar6);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&ovlpEnd,&inEnd.super_CoreDims,&outEnd.super_CoreDims,
                 pCVar6);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&ovlpCount,&ovlpStart.super_CoreDims,
                 &ovlpEnd.super_CoreDims,pCVar6);
      bVar2 = NdCopy::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&ovlpStart,&ovlpEnd.super_CoreDims,ovlpEnd_03);
      if (!bVar2) {
        return 1;
      }
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&inStride,&inMemCountNC.super_CoreDims,
                 (CoreDims *)(long)typeSize,(size_t)pCVar6);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&outStride,&outMemCountNC.super_CoreDims,
                 (CoreDims *)(long)typeSize,(size_t)pCVar6);
      std::__reverse<unsigned_long*>
                (outStride.super_CoreDims.DimensSpan,
                 outStride.super_CoreDims.DimensSpan + outStride.super_CoreDims.DimCount);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&inRltvOvlpStartPos,&inMemStartNC.super_CoreDims,
                 &ovlpStart.super_CoreDims,pCVar6);
      sVar10 = ovlpStart.super_CoreDims.DimCount;
      blockSize = ovlpStart.super_CoreDims.DimCount;
      local_1128 = local_1120;
      memset(local_1120,0,0x100);
      if (sVar10 != 0) {
        memmove(local_1120,ovlpStart.super_CoreDims.DimensSpan,sVar10 * 8);
      }
      std::__reverse<unsigned_long*>(local_1120,local_1120 + sVar10);
      ioStart = (DimsArray *)&blockSize;
    }
    else {
      if (!outIsRowMajor || (char)local_136c != '\0') goto LAB_00461281;
      psVar1 = revInStart.Dimensions;
      revInStart.super_CoreDims.DimCount = sVar10;
      revInStart.super_CoreDims.DimensSpan = psVar1;
      memset(psVar1,0,0x100);
      if (sVar10 != 0) {
        memmove(psVar1,local_1388->DimensSpan,sVar10 << 3);
      }
      pCVar12 = local_1398;
      sVar10 = local_1398->DimCount;
      minContDim = sVar10;
      local_1018 = local_1010;
      memset(local_1010,0,0x100);
      if (sVar10 != 0) {
        memmove(local_1010,pCVar12->DimensSpan,sVar10 << 3);
      }
      std::__reverse<unsigned_long*>(inMemStartNC.Dimensions,inMemStartNC.Dimensions + local_1368);
      std::__reverse<unsigned_long*>
                (inMemCountNC.super_CoreDims.DimensSpan,
                 inMemCountNC.super_CoreDims.DimensSpan + inMemCountNC.super_CoreDims.DimCount);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&inEnd,&revInStart.super_CoreDims,
                 (CoreDims *)&minContDim,pCVar6);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&outEnd,outStart,outCount,pCVar6);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&ovlpStart,&revInStart.super_CoreDims,outStart,pCVar6);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&ovlpEnd,&inEnd.super_CoreDims,&outEnd.super_CoreDims,
                 pCVar6);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&ovlpCount,&ovlpStart.super_CoreDims,
                 &ovlpEnd.super_CoreDims,pCVar6);
      bVar2 = NdCopy::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&ovlpStart,&ovlpEnd.super_CoreDims,ovlpEnd_00);
      if (!bVar2) {
        return 1;
      }
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&outStride,&outMemCountNC.super_CoreDims,
                 (CoreDims *)(long)typeSize,(size_t)pCVar6);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&inStride,&inMemCountNC.super_CoreDims,
                 (CoreDims *)(long)typeSize,(size_t)pCVar6);
      std::__reverse<unsigned_long*>();
      sVar10 = ovlpStart.super_CoreDims.DimCount;
      blockSize = ovlpStart.super_CoreDims.DimCount;
      local_1128 = local_1120;
      memset(local_1120,0,0x100);
      if (sVar10 != 0) {
        memmove(local_1120,ovlpStart.super_CoreDims.DimensSpan,sVar10 * 8);
      }
      std::__reverse<unsigned_long*>(local_1120,local_1120 + sVar10);
      NdCopy::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)&inRltvOvlpStartPos,&inMemStartNC.super_CoreDims,
                 (CoreDims *)&blockSize,pCVar6);
      ioStart = &ovlpStart;
    }
    NdCopy::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&outRltvOvlpStartPos,&outMemStartNC.super_CoreDims,
               &ioStart->super_CoreDims,pCVar6);
  }
LAB_00461281:
  local_1380 = outBase;
  elmSize = (size_t)typeSize;
  local_1378 = in;
  if ((bool)(char)local_138c == outIsLittleEndian) {
    if (safeMode) {
      DimsArray::DimsArray(&revInStart,ovlpCount.super_CoreDims.DimCount + 1,0);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&minContDim,
                 ovlpCount.super_CoreDims.DimCount + 1,(allocator_type *)&blockSize);
      *(char **)minContDim = in;
      std::vector<char_*,_std::allocator<char_*>_>::vector
                ((vector<char_*,_std::allocator<char_*>_> *)&blockSize,
                 ovlpCount.super_CoreDims.DimCount + 1,&local_1399);
      *(char **)blockSize = outBase;
      sVar10 = 0;
      do {
        for (; sVar10 != inStride.super_CoreDims.DimCount; sVar10 = sVar10 + 1) {
          *(size_t *)(minContDim + 8 + sVar10 * 8) =
               (revInStart.super_CoreDims.DimensSpan[sVar10] +
               inRltvOvlpStartPos.super_CoreDims.DimensSpan[sVar10]) *
               inStride.super_CoreDims.DimensSpan[sVar10] + *(long *)(minContDim + sVar10 * 8);
          *(size_t *)(blockSize + 8 + sVar10 * 8) =
               (revInStart.super_CoreDims.DimensSpan[sVar10] +
               outRltvOvlpStartPos.super_CoreDims.DimensSpan[sVar10]) *
               outStride.super_CoreDims.DimensSpan[sVar10] + *(long *)(blockSize + sVar10 * 8);
          revInStart.super_CoreDims.DimensSpan[sVar10] =
               revInStart.super_CoreDims.DimensSpan[sVar10] + 1;
        }
        memcpy(*(void **)(blockSize + sVar10 * 8),*(void **)(minContDim + sVar10 * 8),elmSize);
        sVar4 = sVar10;
        do {
          sVar10 = sVar4 - 1;
          if (sVar4 == 0) goto LAB_0046165d;
          revInStart.super_CoreDims.DimensSpan[sVar4] = 0;
          sVar4 = sVar10;
        } while (revInStart.super_CoreDims.DimensSpan[sVar10] ==
                 ovlpCount.super_CoreDims.DimensSpan[sVar10]);
      } while( true );
    }
    NdCopyRecurDFNonSeqDynamic
              (0,in,outBase,&inRltvOvlpStartPos.super_CoreDims,&outRltvOvlpStartPos.super_CoreDims,
               &inStride.super_CoreDims,&outStride.super_CoreDims,&ovlpCount.super_CoreDims,elmSize)
    ;
  }
  else {
    if (safeMode) {
      DimsArray::DimsArray(&revInStart,ovlpCount.super_CoreDims.DimCount + 1,0);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&minContDim,
                 ovlpCount.super_CoreDims.DimCount + 1,(allocator_type *)&blockSize);
      *(char **)minContDim = in;
      std::vector<char_*,_std::allocator<char_*>_>::vector
                ((vector<char_*,_std::allocator<char_*>_> *)&blockSize,
                 ovlpCount.super_CoreDims.DimCount + 1,&local_1399);
      *(char **)blockSize = outBase;
      sVar10 = 0;
      do {
        for (; sVar10 != inStride.super_CoreDims.DimCount; sVar10 = sVar10 + 1) {
          *(size_t *)(minContDim + 8 + sVar10 * 8) =
               (revInStart.super_CoreDims.DimensSpan[sVar10] +
               inRltvOvlpStartPos.super_CoreDims.DimensSpan[sVar10]) *
               inStride.super_CoreDims.DimensSpan[sVar10] + *(long *)(minContDim + sVar10 * 8);
          *(size_t *)(blockSize + 8 + sVar10 * 8) =
               (revInStart.super_CoreDims.DimensSpan[sVar10] +
               outRltvOvlpStartPos.super_CoreDims.DimensSpan[sVar10]) *
               outStride.super_CoreDims.DimensSpan[sVar10] + *(long *)(blockSize + sVar10 * 8);
          revInStart.super_CoreDims.DimensSpan[sVar10] =
               revInStart.super_CoreDims.DimensSpan[sVar10] + 1;
        }
        lVar7 = 0;
        sVar9 = elmSize;
        while (sVar9 != 0) {
          *(undefined1 *)(*(long *)(blockSize + sVar10 * 8) + lVar7) =
               *(undefined1 *)(*(long *)(minContDim + sVar10 * 8) + -1 + sVar9);
          lVar7 = lVar7 + 1;
          sVar9 = sVar9 - 1;
        }
        do {
          sVar4 = sVar10 - 1;
          if (sVar10 == 0) {
LAB_0046165d:
            std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
                      ((_Vector_base<char_*,_std::allocator<char_*>_> *)&blockSize);
            std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                      ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&minContDim);
            return 0;
          }
          revInStart.super_CoreDims.DimensSpan[sVar10] = 0;
          sVar10 = sVar4;
        } while (revInStart.super_CoreDims.DimensSpan[sVar4] ==
                 ovlpCount.super_CoreDims.DimensSpan[sVar4]);
      } while( true );
    }
    NdCopyRecurDFNonSeqDynamicRevEndian
              (0,in,outBase,&inRltvOvlpStartPos.super_CoreDims,&outRltvOvlpStartPos.super_CoreDims,
               &inStride.super_CoreDims,&outStride.super_CoreDims,&ovlpCount.super_CoreDims,elmSize)
    ;
  }
  return 0;
}

Assistant:

int NdCopy(const char *in, const CoreDims &inStart, const CoreDims &inCount,
           const bool inIsRowMajor, const bool inIsLittleEndian, char *out,
           const CoreDims &outStart, const CoreDims &outCount, const bool outIsRowMajor,
           const bool outIsLittleEndian, const int typeSize, const CoreDims &inMemStart,
           const CoreDims &inMemCount, const CoreDims &outMemStart, const CoreDims &outMemCount,
           const bool safeMode, const MemorySpace MemSpace, const bool duringWrite)

{

    // use values of ioStart and ioCount if ioMemStart and ioMemCount are
    // left as default
    DimsArray inMemStartNC = inMemStart.empty() ? inStart : inMemStart;
    DimsArray inMemCountNC = inMemCount.empty() ? inCount : inMemCount;
    DimsArray outMemStartNC = outMemStart.empty() ? outStart : outMemStart;
    DimsArray outMemCountNC = outMemCount.empty() ? outCount : outMemCount;

    DimsArray inEnd(inStart.size());
    DimsArray outEnd(inStart.size());
    DimsArray ovlpStart(inStart.size());
    DimsArray ovlpEnd(inStart.size());
    DimsArray ovlpCount(inStart.size());
    DimsArray inStride(inStart.size());
    DimsArray outStride(inStart.size());
    DimsArray inOvlpGapSize(inStart.size());
    DimsArray outOvlpGapSize(inStart.size());
    DimsArray inRltvOvlpStartPos(inStart.size());
    DimsArray outRltvOvlpStartPos(inStart.size());
    size_t minContDim, blockSize;
    const char *inOvlpBase = nullptr;
    char *outOvlpBase = nullptr;
    auto GetInEnd = [](CoreDims &inEnd, const CoreDims &inStart, const CoreDims &inCount) {
        for (size_t i = 0; i < inStart.size(); i++)
        {
            inEnd[i] = inStart[i] + inCount[i] - 1;
        }
    };
    auto GetOutEnd = [](CoreDims &outEnd, const CoreDims &outStart, const CoreDims &output_count) {
        for (size_t i = 0; i < outStart.size(); i++)
        {
            outEnd[i] = outStart[i] + output_count[i] - 1;
        }
    };
    auto GetOvlpStart = [](CoreDims &ovlpStart, const CoreDims &inStart, const CoreDims &outStart) {
        for (size_t i = 0; i < ovlpStart.size(); i++)
        {
            ovlpStart[i] = inStart[i] > outStart[i] ? inStart[i] : outStart[i];
        }
    };
    auto GetOvlpEnd = [](CoreDims &ovlpEnd, CoreDims &inEnd, CoreDims &outEnd) {
        for (size_t i = 0; i < ovlpEnd.size(); i++)
        {
            ovlpEnd[i] = inEnd[i] < outEnd[i] ? inEnd[i] : outEnd[i];
        }
    };
    auto GetOvlpCount = [](CoreDims &ovlpCount, CoreDims &ovlpStart, CoreDims &ovlpEnd) {
        for (size_t i = 0; i < ovlpCount.size(); i++)
        {
            ovlpCount[i] = ovlpEnd[i] - ovlpStart[i] + 1;
        }
    };
    auto HasOvlp = [](CoreDims &ovlpStart, CoreDims &ovlpEnd) {
        for (size_t i = 0; i < ovlpStart.size(); i++)
        {
            if (ovlpEnd[i] < ovlpStart[i])
            {
                return false;
            }
        }
        return true;
    };

    auto GetIoStrides = [](CoreDims &ioStride, const CoreDims &ioCount, size_t elmSize) {
        // ioStride[i] holds the total number of elements under each element
        // of the i'th dimension
        ioStride[ioStride.size() - 1] = elmSize;
        if (ioStride.size() > 1)
        {
            ioStride[ioStride.size() - 2] = ioCount[ioStride.size() - 1] * elmSize;
        }
        if (ioStride.size() > 2)
        {
            size_t i = ioStride.size() - 3;
            while (true)
            {
                ioStride[i] = ioCount[i + 1] * ioStride[i + 1];
                if (i == 0)
                {
                    break;
                }
                else
                {
                    i--;
                }
            }
        }
    };

    auto GetInOvlpBase = [](const char *&inOvlpBase, const char *in, const CoreDims &inStart,
                            CoreDims &inStride, CoreDims &ovlpStart) {
        inOvlpBase = in;
        for (size_t i = 0; i < inStart.size(); i++)
        {
            inOvlpBase = inOvlpBase + (ovlpStart[i] - inStart[i]) * inStride[i];
        }
    };
    auto GetOutOvlpBase = [](char *&outOvlpBase, char *out, const CoreDims &outStart,
                             CoreDims &outStride, CoreDims &ovlpStart) {
        outOvlpBase = out;
        for (size_t i = 0; i < outStart.size(); i++)
        {
            outOvlpBase = outOvlpBase + (ovlpStart[i] - outStart[i]) * outStride[i];
        }
    };
    auto GetIoOvlpGapSize = [](CoreDims &ioOvlpGapSize, CoreDims &ioStride, const CoreDims &ioCount,
                               CoreDims &ovlpCount) {
        for (size_t i = 0; i < ioOvlpGapSize.size(); i++)
        {
            ioOvlpGapSize[i] = (ioCount[i] - ovlpCount[i]) * ioStride[i];
        }
    };
    auto GetMinContDim = [](const CoreDims &inCount, const CoreDims &outCount,
                            CoreDims &ovlpCount) {
        //    note: minContDim is the first index where its input box and
        //    overlap box
        //    are not fully match. therefore all data below this branch is
        //    contingous
        //    and this determins the Biggest continuous block size - Each
        //    element of the
        //    current dimension.
        size_t i = ovlpCount.size() - 1;
        while (true)
        {
            if (i == 0)
            {
                break;
            }
            if ((inCount[i] != ovlpCount[i]) || (outCount[i] != ovlpCount[i]))
            {
                break;
            }
            i--;
        }
        return i;
    };
    auto GetBlockSize = [](CoreDims &ovlpCount, size_t minContDim, size_t elmSize) {
        size_t res = elmSize;
        for (size_t i = minContDim; i < ovlpCount.size(); i++)
        {
            res *= ovlpCount[i];
        }
        return res;
    };

    auto GetRltvOvlpStartPos = [](CoreDims &ioRltvOvlpStart, const CoreDims &ioStart,
                                  CoreDims &ovlpStart) {
        for (size_t i = 0; i < ioStart.size(); i++)
        {
            ioRltvOvlpStart[i] = ovlpStart[i] - ioStart[i];
        }
    };

    // main flow
    // row-major ==> row-major mode
    // algrithm optimizations:
    // 1. contigous data copying
    // 2. mem pointer arithmetics by sequential padding. O(1) overhead/block
    if (inIsRowMajor && outIsRowMajor)
    {
        GetInEnd(inEnd, inStart, inCount);
        GetOutEnd(outEnd, outStart, outCount);
        GetOvlpStart(ovlpStart, inStart, outStart);
        GetOvlpEnd(ovlpEnd, inEnd, outEnd);
        GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
        if (!HasOvlp(ovlpStart, ovlpEnd))
        {
            return 1; // no overlap found
        }
        GetIoStrides(inStride, inMemCountNC, typeSize);
        GetIoStrides(outStride, outMemCountNC, typeSize);
        GetIoOvlpGapSize(inOvlpGapSize, inStride, inMemCountNC, ovlpCount);
        GetIoOvlpGapSize(outOvlpGapSize, outStride, outMemCountNC, ovlpCount);
        GetInOvlpBase(inOvlpBase, in, inMemStartNC, inStride, ovlpStart);
        GetOutOvlpBase(outOvlpBase, out, outMemStartNC, outStride, ovlpStart);
        minContDim = GetMinContDim(inMemCountNC, outMemCountNC, ovlpCount);
        blockSize = GetBlockSize(ovlpCount, minContDim, typeSize);
        // same endianess mode: most optimized, contiguous data copying
        // algorithm used.
        if (inIsLittleEndian == outIsLittleEndian)
        {
#ifdef ADIOS2_HAVE_GPU_SUPPORT
            if (MemSpace == MemorySpace::GPU)
            {
                helper::NdCopyGPU(inOvlpBase, outOvlpBase, inOvlpGapSize, outOvlpGapSize, ovlpCount,
                                  minContDim, blockSize, MemSpace, duringWrite);
                return 0;
            }
#endif
            // most efficient algm
            // warning: number of function stacks used is number of dimensions
            // of data.
            if (!safeMode)
            {
                NdCopyRecurDFSeqPadding(0, inOvlpBase, outOvlpBase, inOvlpGapSize, outOvlpGapSize,
                                        ovlpCount, minContDim, blockSize);
            }
            else // safeMode
            {
                //      //alternative iterative version, 10% slower then
                //      recursive
                //      //use it when very high demension is used.
                NdCopyIterDFSeqPadding(inOvlpBase, outOvlpBase, inOvlpGapSize, outOvlpGapSize,
                                       ovlpCount, minContDim, blockSize);
            }
        }
        // different endianess mode
        else
        {
#ifdef ADIOS2_HAVE_GPU_SUPPORT
            if (MemSpace == MemorySpace::GPU)
            {
                helper::Throw<std::invalid_argument>(
                    "Helper", "Memory", "CopyContiguousMemory",
                    "Direct byte order reversal not supported for GPU buffers");
            }
#endif
            if (!safeMode)
            {
                NdCopyRecurDFSeqPaddingRevEndian(0, inOvlpBase, outOvlpBase, inOvlpGapSize,
                                                 outOvlpGapSize, ovlpCount, minContDim, blockSize,
                                                 typeSize, blockSize / typeSize);
            }
            else
            {
                NdCopyIterDFSeqPaddingRevEndian(inOvlpBase, outOvlpBase, inOvlpGapSize,
                                                outOvlpGapSize, ovlpCount, minContDim, blockSize,
                                                typeSize, blockSize / typeSize);
            }
        }
    }

    // Copying modes involing col-major
    // algorithm optimization:
    // 1. mem ptr arithmetics: O(1) overhead per block, dynamic/non-sequential
    // padding
    else
    {
#ifdef ADIOS2_HAVE_GPU_SUPPORT
        if (MemSpace == MemorySpace::GPU)
        {
            helper::Throw<std::invalid_argument>(
                "Helper", "Memory", "CopyContiguousMemory",
                "Direct byte order reversal not supported for GPU buffers");
        }
#endif
        //        CoreDims revInCount(inCount);
        //        CoreDims revOutCount(outCount);
        //
        // col-major ==> col-major mode
        if (!inIsRowMajor && !outIsRowMajor)
        {

            GetInEnd(inEnd, inStart, inCount);
            GetOutEnd(outEnd, outStart, outCount);
            GetOvlpStart(ovlpStart, inStart, outStart);
            GetOvlpEnd(ovlpEnd, inEnd, outEnd);
            GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
            if (!HasOvlp(ovlpStart, ovlpEnd))
            {
                return 1; // no overlap found
            }

            GetIoStrides(inStride, inCount, typeSize);
            GetIoStrides(outStride, outCount, typeSize);

            GetRltvOvlpStartPos(inRltvOvlpStartPos, inMemStartNC, ovlpStart);
            GetRltvOvlpStartPos(outRltvOvlpStartPos, outMemStartNC, ovlpStart);
        }
        // row-major ==> col-major mode
        else if (inIsRowMajor && !outIsRowMajor)
        {
            DimsArray revOutStart(outStart);
            DimsArray revOutCount(outCount);

            std::reverse(outMemStartNC.begin(), outMemStartNC.end());
            std::reverse(outMemCountNC.begin(), outMemCountNC.end());

            GetInEnd(inEnd, inStart, inCount);
            GetOutEnd(outEnd, revOutStart, revOutCount);
            GetOvlpStart(ovlpStart, inStart, revOutStart);
            GetOvlpEnd(ovlpEnd, inEnd, outEnd);
            GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
            if (!HasOvlp(ovlpStart, ovlpEnd))
            {
                return 1; // no overlap found
            }

            // get normal order inStride
            GetIoStrides(inStride, inMemCountNC, typeSize);

            // calulate reversed order outStride
            GetIoStrides(outStride, outMemCountNC, typeSize);
            // reverse outStride so that outStride aligns to inStride
            std::reverse(outStride.begin(), outStride.end());

            // get normal order inOvlpStart
            GetRltvOvlpStartPos(inRltvOvlpStartPos, inMemStartNC, ovlpStart);

            // get reversed order outOvlpStart
            DimsArray revOvlpStart(ovlpStart);
            std::reverse(revOvlpStart.begin(), revOvlpStart.end());
            GetRltvOvlpStartPos(outRltvOvlpStartPos, outMemStartNC, revOvlpStart);
        }
        // col-major ==> row-major mode
        else if (!inIsRowMajor && outIsRowMajor)
        {
            DimsArray revInStart(inStart);
            DimsArray revInCount(inCount);
            std::reverse(inMemStartNC.begin(), inMemStartNC.end());
            std::reverse(inMemCountNC.begin(), inMemCountNC.end());

            GetInEnd(inEnd, revInStart, revInCount);
            GetOutEnd(outEnd, outStart, outCount);
            GetOvlpStart(ovlpStart, revInStart, outStart);
            GetOvlpEnd(ovlpEnd, inEnd, outEnd);
            GetOvlpCount(ovlpCount, ovlpStart, ovlpEnd);
            if (!HasOvlp(ovlpStart, ovlpEnd))
            {
                return 1; // no overlap found
            }

            // get normal order outStride
            GetIoStrides(outStride, outMemCountNC, typeSize);

            // calculate reversed inStride
            GetIoStrides(inStride, inMemCountNC, typeSize);
            // reverse inStride so that inStride aligns to outStride
            std::reverse(inStride.begin(), inStride.end());

            // get reversed order inOvlpStart
            DimsArray revOvlpStart(ovlpStart);
            std::reverse(revOvlpStart.begin(), revOvlpStart.end());
            GetRltvOvlpStartPos(inRltvOvlpStartPos, inMemStartNC, revOvlpStart);
            // get normal order outOvlpStart
            GetRltvOvlpStartPos(outRltvOvlpStartPos, outMemStartNC, ovlpStart);
        }

        inOvlpBase = in;
        outOvlpBase = out;
        // Same Endian"
        if (inIsLittleEndian == outIsLittleEndian)
        {
            if (!safeMode)
            {
                NdCopyRecurDFNonSeqDynamic(0, inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                           outRltvOvlpStartPos, inStride, outStride, ovlpCount,
                                           typeSize);
            }
            else
            {
                NdCopyIterDFDynamic(inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                    outRltvOvlpStartPos, inStride, outStride, ovlpCount, typeSize);
            }
        }
        // different Endian"
        else
        {
            if (!safeMode)
            {
                NdCopyRecurDFNonSeqDynamicRevEndian(0, inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                                    outRltvOvlpStartPos, inStride, outStride,
                                                    ovlpCount, typeSize);
            }
            else
            {
                NdCopyIterDFDynamicRevEndian(inOvlpBase, outOvlpBase, inRltvOvlpStartPos,
                                             outRltvOvlpStartPos, inStride, outStride, ovlpCount,
                                             typeSize);
            }
        }
    }
    return 0;
}